

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O1

void __thiscall
TypeTest_HeapTypeConstructors_Test::TestBody(TypeTest_HeapTypeConstructors_Test *this)

{
  pointer pHVar1;
  Nullability NVar2;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar3;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  Signature SVar5;
  initializer_list<wasm::Field> __l;
  Array AVar6;
  initializer_list<wasm::Field> __l_00;
  Array AVar7;
  Signature SVar8;
  initializer_list<wasm::Field> __l_01;
  Array AVar9;
  ulong local_108 [2];
  ulong local_f8 [2];
  HeapType local_e8;
  HeapType sig2;
  HeapType struct2;
  HeapType array;
  HeapType sig;
  BuildResult result;
  HeapType local_a0;
  HeapType struct_;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  TypeBuilder local_70;
  TypeBuilder builder;
  HeapType array2;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  local_58;
  AssertHelper local_50;
  Field local_48;
  undefined1 auStack_38 [8];
  AssertionResult gtest_ar_;
  
  SVar5.results.id = 2;
  SVar5.params.id = 2;
  ::wasm::HeapType::HeapType(&array,SVar5);
  if (((uint)(0x7c < array.id) * 4 + 3 & (uint)array.id) == 0) {
    auStack_38 = (undefined1  [8])(array.id | 2);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0x1000000;
    __l._M_len = 1;
    __l._M_array = (iterator)auStack_38;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&struct_,__l,
               (allocator_type *)&builder);
    pHVar1 = built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sig = struct_;
    struct_.id = 0;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::wasm::HeapType::HeapType(&local_a0,(Struct *)&sig);
    uVar3 = extraout_RDX;
    if (sig.id != 0) {
      operator_delete((void *)sig.id,(long)pHVar1 - sig.id);
      uVar3 = extraout_RDX_00;
    }
    if (struct_.id != 0) {
      operator_delete((void *)struct_.id,
                      (long)built.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - struct_.id);
      uVar3 = extraout_RDX_01;
    }
    if (((uint)(0x7c < local_a0.id) * 4 + 3 & (uint)local_a0.id) == 0) {
      local_108[0] = local_a0.id | 2;
      local_108[1] = 0x100000000;
      AVar6.element.packedType = (int)uVar3;
      AVar6.element.mutable_ = (int)((ulong)uVar3 >> 0x20);
      AVar6.element.type.id = (uintptr_t)local_108;
      ::wasm::HeapType::HeapType(&struct2,AVar6);
      ::wasm::TypeBuilder::TypeBuilder(&local_70,3);
      ::wasm::TypeBuilder::setHeapType((ulong)&local_70,(Signature)(ZEXT816(2) << 0x40));
      NVar2 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_70);
      auStack_38 = (undefined1  [8])
                   ::wasm::TypeBuilder::getTempRefType((HeapType)&local_70,NVar2,Exact);
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0x1000000;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)auStack_38;
      std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&struct_,__l_00,
                 (allocator_type *)&builder);
      pHVar1 = built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish;
      sig = struct_;
      struct_.id = 0;
      built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ::wasm::TypeBuilder::setHeapType((ulong)&local_70,(Struct *)0x1);
      if (sig.id != 0) {
        operator_delete((void *)sig.id,(long)pHVar1 - sig.id);
      }
      if (struct_.id != 0) {
        operator_delete((void *)struct_.id,
                        (long)built.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - struct_.id);
      }
      NVar2 = ::wasm::TypeBuilder::getTempHeapType((ulong)&local_70);
      sig.id = ::wasm::TypeBuilder::getTempRefType((HeapType)&local_70,NVar2,Exact);
      AVar7.element._8_8_ = &sig;
      AVar7.element.type.id = 2;
      ::wasm::TypeBuilder::setHeapType((ulong)&local_70,AVar7);
      ::wasm::TypeBuilder::build();
      auStack_38[0] =
           (internal)
           (result.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._M_first._M_storage._M_storage[0x10] == '\0');
      gtest_ar_.success_ = false;
      gtest_ar_._1_7_ = 0;
      if (result.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
          _M_first._M_storage._M_storage[0x10] != '\0') {
        testing::Message::Message((Message *)&builder);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&struct_,(internal *)auStack_38,(AssertionResult *)"result","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_48,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x266,(char *)struct_.id);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&builder);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
        if ((pointer *)struct_.id !=
            &built.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete((void *)struct_.id,
                          (ulong)((long)&(built.
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
        }
        if (builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)builder.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl + 8))();
        }
        if (gtest_ar_._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar_._0_8_);
        }
LAB_001e5bc1:
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
          ::_S_vtable._M_arr
          [result.
           super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
           .
           super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
           .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
           super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
           super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
           super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
           super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
           _M_first._M_storage._M_storage[0x10]]._M_data)
                  ((anon_class_1_0_00000001 *)&struct_,
                   (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    *)&sig);
        ::wasm::TypeBuilder::~TypeBuilder(&local_70);
        return;
      }
      __x = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)&sig);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&struct_,__x);
      testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                ((internal *)auStack_38,"built[0]","sig",(HeapType *)struct_.id,&array);
      if (auStack_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&builder);
        if (gtest_ar_._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x269,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&builder);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
        if (builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)builder.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                ((internal *)auStack_38,"built[1]","struct_",(HeapType *)(struct_.id + 8),&local_a0)
      ;
      if (auStack_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&builder);
        if (gtest_ar_._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x26a,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&builder);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
        if (builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)builder.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                ((internal *)auStack_38,"built[2]","array",(HeapType *)(struct_.id + 0x10),&struct2)
      ;
      if (auStack_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&builder);
        if (gtest_ar_._0_8_ == 0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)gtest_ar_._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_48,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x26b,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&builder);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
        if (builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
             )0x0) {
          (**(code **)(*(long *)builder.impl._M_t.
                                super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                _M_head_impl + 8))();
        }
      }
      if (gtest_ar_._0_8_ != 0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&gtest_ar_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar_._0_8_);
      }
      SVar8.results.id = 2;
      SVar8.params.id = 2;
      ::wasm::HeapType::HeapType(&local_e8,SVar8);
      if (((uint)(0x7c < array.id) * 4 + 3 & (uint)array.id) == 0) {
        local_48.type.id = array.id | 2;
        local_48.packedType = not_packed;
        local_48.mutable_ = Mutable;
        __l_01._M_len = 1;
        __l_01._M_array = &local_48;
        std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                  ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&builder,__l_01,
                   (allocator_type *)&local_50);
        auStack_38 = (undefined1  [8])
                     builder.impl._M_t.
                     super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                     .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
        gtest_ar_._0_8_ = array2.id;
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )local_58.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        builder.impl._M_t.
        super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
        ._M_t.
        super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
        .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
             (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
             (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
              )0x0;
        ::wasm::HeapType::HeapType(&sig2,(Struct *)auStack_38);
        uVar3 = extraout_RDX_02;
        if (auStack_38 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_38,
                          (long)gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl - (long)auStack_38);
          uVar3 = extraout_RDX_03;
        }
        if (builder.impl._M_t.
            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
            ._M_t.
            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl !=
            (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
             )0x0) {
          operator_delete((void *)builder.impl._M_t.
                                  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                  .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                  _M_head_impl,
                          -(long)builder.impl._M_t.
                                 super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                                 .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>.
                                 _M_head_impl);
          uVar3 = extraout_RDX_04;
        }
        if (((uint)(0x7c < local_a0.id) * 4 + 3 & (uint)local_a0.id) == 0) {
          local_f8[0] = local_a0.id | 2;
          local_f8[1] = 0x100000000;
          AVar9.element.packedType = (int)uVar3;
          AVar9.element.mutable_ = (int)((ulong)uVar3 >> 0x20);
          AVar9.element.type.id = (uintptr_t)local_f8;
          ::wasm::HeapType::HeapType((HeapType *)&builder,AVar9);
          testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                    ((internal *)auStack_38,"sig","sig2",&array,&local_e8);
          if (auStack_38[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar_._0_8_ == 0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar_._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x271,pcVar4);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((long *)local_48.type.id != (long *)0x0) {
              (**(code **)(*(long *)local_48.type.id + 8))();
            }
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
          testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                    ((internal *)auStack_38,"struct_","struct2",&local_a0,&sig2);
          if (auStack_38[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar_._0_8_ == 0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar_._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x272,pcVar4);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((long *)local_48.type.id != (long *)0x0) {
              (**(code **)(*(long *)local_48.type.id + 8))();
            }
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
          testing::internal::CmpHelperEQ<wasm::HeapType,wasm::HeapType>
                    ((internal *)auStack_38,"array","array2",&struct2,(HeapType *)&builder);
          if (auStack_38[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_48);
            if (gtest_ar_._0_8_ == 0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)gtest_ar_._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x273,pcVar4);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((long *)local_48.type.id != (long *)0x0) {
              (**(code **)(*(long *)local_48.type.id + 8))();
            }
          }
          if (gtest_ar_._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar_._0_8_);
          }
          if (struct_.id != 0) {
            operator_delete((void *)struct_.id,
                            (long)built.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - struct_.id);
          }
          goto LAB_001e5bc1;
        }
      }
    }
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

TEST_F(TypeTest, HeapTypeConstructors) {
  HeapType sig(Signature(Type::i32, Type::i32));
  HeapType struct_(Struct({Field(Type(sig, Nullable), Mutable)}));
  HeapType array(Field(Type(struct_, Nullable), Mutable));

  TypeBuilder builder(3);
  builder[0] = Signature(Type::i32, Type::i32);
  Type sigRef = builder.getTempRefType(builder[0], Nullable);
  builder[1] = Struct({Field(sigRef, Mutable)});
  Type structRef = builder.getTempRefType(builder[1], Nullable);
  builder[2] = Array(Field(structRef, Mutable));

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  EXPECT_EQ(built[0], sig);
  EXPECT_EQ(built[1], struct_);
  EXPECT_EQ(built[2], array);

  HeapType sig2(Signature(Type::i32, Type::i32));
  HeapType struct2(Struct({Field(Type(sig, Nullable), Mutable)}));
  HeapType array2(Field(Type(struct_, Nullable), Mutable));

  EXPECT_EQ(sig, sig2);
  EXPECT_EQ(struct_, struct2);
  EXPECT_EQ(array, array2);
}